

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary.cc
# Opt level: O1

ClientMetric * __thiscall
prometheus::Summary::Collect(ClientMetric *__return_storage_ptr__,Summary *this)

{
  vector<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
  *this_00;
  pointer *ppQVar1;
  pointer pQVar2;
  iterator __position;
  int iVar3;
  undefined8 uVar4;
  Quantiles *__range1;
  Quantile *quantile;
  pointer pQVar5;
  pthread_mutex_t *local_50;
  Quantile local_48;
  
  memset(__return_storage_ptr__,0,0x90);
  (__return_storage_ptr__->info).value = 1.0;
  (__return_storage_ptr__->summary).sample_count = 0;
  (__return_storage_ptr__->summary).sample_sum = 0.0;
  (__return_storage_ptr__->summary).quantile.
  super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->summary).quantile.
  super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->summary).quantile.
  super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->histogram).sample_count = 0;
  (__return_storage_ptr__->histogram).sample_sum = 0.0;
  (__return_storage_ptr__->histogram).bucket.
  super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->histogram).bucket.
  super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->histogram).bucket.
  super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->untyped).value = 0.0;
  __return_storage_ptr__->timestamp_ms = 0;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar3 == 0) {
    this_00 = &(__return_storage_ptr__->summary).quantile;
    std::
    vector<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
    ::reserve(this_00,(long)(this->quantiles_).
                            super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->quantiles_).
                            super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5);
    pQVar5 = (this->quantiles_).
             super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pQVar2 = (this->quantiles_).
             super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pQVar5 != pQVar2) {
      do {
        local_48.value = 0.0;
        local_48.quantile = pQVar5->quantile;
        local_48.value = detail::TimeWindowQuantiles::get(&this->quantile_values_,local_48.quantile)
        ;
        __position._M_current =
             (__return_storage_ptr__->summary).quantile.
             super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->summary).quantile.
            super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
          ::_M_realloc_insert<prometheus::ClientMetric::Quantile>(this_00,__position,&local_48);
        }
        else {
          (__position._M_current)->quantile = local_48.quantile;
          (__position._M_current)->value = local_48.value;
          ppQVar1 = &(__return_storage_ptr__->summary).quantile.
                     super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppQVar1 = *ppQVar1 + 1;
        }
        pQVar5 = pQVar5 + 1;
      } while (pQVar5 != pQVar2);
    }
    (__return_storage_ptr__->summary).sample_count = this->count_;
    (__return_storage_ptr__->summary).sample_sum = this->sum_;
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    return __return_storage_ptr__;
  }
  uVar4 = std::__throw_system_error(iVar3);
  pthread_mutex_unlock(local_50);
  ClientMetric::~ClientMetric(__return_storage_ptr__);
  _Unwind_Resume(uVar4);
}

Assistant:

ClientMetric Summary::Collect() const {
  auto metric = ClientMetric{};

  std::lock_guard<std::mutex> lock(mutex_);

  metric.summary.quantile.reserve(quantiles_.size());
  for (const auto& quantile : quantiles_) {
    auto metricQuantile = ClientMetric::Quantile{};
    metricQuantile.quantile = quantile.quantile;
    metricQuantile.value = quantile_values_.get(quantile.quantile);
    metric.summary.quantile.push_back(std::move(metricQuantile));
  }
  metric.summary.sample_count = count_;
  metric.summary.sample_sum = sum_;

  return metric;
}